

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall snestistics::Range::add(Range *this,int v)

{
  bool bVar1;
  int v_local;
  Range *this_local;
  
  bVar1 = fits(this,v);
  if (!bVar1) {
    __assert_fail("fits(v)",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/utils.h"
                  ,0x90,"void snestistics::Range::add(int)");
  }
  if (this->N == 0) {
    this->first = v;
  }
  if (this->N == 1) {
    this->step = v - this->first;
  }
  if (this->first + this->step * this->N == v) {
    this->N = this->N + 1;
  }
  return;
}

Assistant:

void add(int v) {
		assert(fits(v));
		if (N==0) first = v;
		if (N==1) { step = v - first; }
		if (first+step*N == v) N++; // Don't increase if we got same
	}